

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mct.c
# Opt level: O2

OPJ_BOOL opj_mct_encode_custom
                   (OPJ_BYTE *pCodingdata,OPJ_UINT32 n,OPJ_BYTE **pData,OPJ_UINT32 pNbComp,
                   OPJ_UINT32 isSigned)

{
  void *pvVar1;
  OPJ_INT32 OVar2;
  OPJ_UINT32 OVar3;
  OPJ_BOOL OVar4;
  void *ptr;
  ulong uVar5;
  int *piVar6;
  void *pvVar7;
  ulong uVar8;
  long lVar9;
  
  uVar8 = (ulong)pNbComp;
  ptr = opj_malloc((ulong)(pNbComp + pNbComp * pNbComp) << 2);
  if (ptr == (void *)0x0) {
    OVar4 = 0;
  }
  else {
    pvVar1 = (void *)((long)ptr + uVar8 * 4);
    for (uVar5 = 0; pNbComp * pNbComp != uVar5; uVar5 = uVar5 + 1) {
      *(int *)((long)pvVar1 + uVar5 * 4) = (int)(*(float *)(pCodingdata + uVar5 * 4) * 8192.0);
    }
    for (OVar3 = 0; OVar3 != n; OVar3 = OVar3 + 1) {
      for (uVar5 = 0; uVar8 != uVar5; uVar5 = uVar5 + 1) {
        *(undefined4 *)((long)ptr + uVar5 * 4) = *(undefined4 *)pData[uVar5];
      }
      pvVar7 = pvVar1;
      for (uVar5 = 0; uVar5 != uVar8; uVar5 = uVar5 + 1) {
        piVar6 = (int *)pData[uVar5];
        *piVar6 = 0;
        for (lVar9 = 0; uVar8 * 4 - lVar9 != 0; lVar9 = lVar9 + 4) {
          OVar2 = opj_int_fix_mul(*(OPJ_INT32 *)((long)pvVar7 + lVar9),
                                  *(OPJ_INT32 *)((long)ptr + lVar9));
          piVar6 = (int *)pData[uVar5];
          *piVar6 = *piVar6 + OVar2;
        }
        pData[uVar5] = (OPJ_BYTE *)(piVar6 + 1);
        pvVar7 = (void *)((long)pvVar7 + lVar9);
      }
    }
    opj_free(ptr);
    OVar4 = 1;
  }
  return OVar4;
}

Assistant:

OPJ_BOOL opj_mct_encode_custom(
					   OPJ_BYTE * pCodingdata,
					   OPJ_UINT32 n,
					   OPJ_BYTE ** pData,
					   OPJ_UINT32 pNbComp,
					   OPJ_UINT32 isSigned)
{
	OPJ_FLOAT32 * lMct = (OPJ_FLOAT32 *) pCodingdata;
	OPJ_UINT32 i;
	OPJ_UINT32 j;
	OPJ_UINT32 k;
	OPJ_UINT32 lNbMatCoeff = pNbComp * pNbComp;
	OPJ_INT32 * lCurrentData = 00;
	OPJ_INT32 * lCurrentMatrix = 00;
	OPJ_INT32 ** lData = (OPJ_INT32 **) pData;
	OPJ_UINT32 lMultiplicator = 1 << 13;
	OPJ_INT32 * lMctPtr;

    OPJ_ARG_NOT_USED(isSigned);

	lCurrentData = (OPJ_INT32 *) opj_malloc((pNbComp + lNbMatCoeff) * sizeof(OPJ_INT32));
	if (! lCurrentData) {
		return OPJ_FALSE;
	}

	lCurrentMatrix = lCurrentData + pNbComp;

	for (i =0;i<lNbMatCoeff;++i) {
		lCurrentMatrix[i] = (OPJ_INT32) (*(lMct++) * (OPJ_FLOAT32)lMultiplicator);
	}

	for (i = 0; i < n; ++i)  {
		lMctPtr = lCurrentMatrix;
		for (j=0;j<pNbComp;++j) {
			lCurrentData[j] = (*(lData[j]));
		}

		for (j=0;j<pNbComp;++j) {
			*(lData[j]) = 0;
			for (k=0;k<pNbComp;++k) {
				*(lData[j]) += opj_int_fix_mul(*lMctPtr, lCurrentData[k]);
				++lMctPtr;
			}

			++lData[j];
		}
	}

	opj_free(lCurrentData);

	return OPJ_TRUE;
}